

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 GenStateCompileCaseExpr(jx9_gen_state *pGen,jx9_case_expr *pExpr)

{
  uint uVar1;
  SyToken *pSVar2;
  jx9_vm *pjVar3;
  SySet *pSVar4;
  sxi32 sVar5;
  sxi32 sVar6;
  jx9_case_expr *pjVar7;
  int iVar8;
  SyToken *pSVar9;
  SySet *pSVar10;
  
  pSVar2 = pGen->pIn;
  pSVar9 = pSVar2;
  if (pSVar2 < pGen->pEnd) {
    iVar8 = 0;
    do {
      uVar1 = pSVar9->nType;
      if ((uVar1 >> 9 & 1) == 0) {
        if ((uVar1 >> 10 & 1) == 0) {
          if (((uVar1 & 0x140000) != 0) && (iVar8 < 1)) break;
        }
        else {
          iVar8 = iVar8 + -1;
        }
      }
      else {
        iVar8 = iVar8 + 1;
      }
      pSVar9 = pSVar9 + 1;
    } while (pSVar9 < pGen->pEnd);
  }
  if ((pSVar9 <= pSVar2) &&
     (sVar5 = jx9GenCompileError(pGen,1,pSVar2->nLine,"Empty case expression"), sVar5 == -10)) {
    return -10;
  }
  pjVar3 = pGen->pVm;
  pSVar2 = pGen->pEnd;
  pGen->pEnd = pSVar9;
  pSVar4 = pjVar3->pByteContainer;
  pjVar7 = (jx9_case_expr *)&pjVar3->aByteCode;
  if (pExpr != (jx9_case_expr *)0x0) {
    pjVar7 = pExpr;
  }
  pjVar3->pByteContainer = &pjVar7->aByteCode;
  sVar5 = 0;
  sVar6 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
  jx9VmEmitInstr(pGen->pVm,1,(uint)(sVar6 != -3),0,(void *)0x0,(sxu32 *)0x0);
  pSVar10 = &pGen->pVm->aByteCode;
  if (pSVar4 != (SySet *)0x0) {
    pSVar10 = pSVar4;
  }
  pGen->pVm->pByteContainer = pSVar10;
  pGen->pIn = pSVar9;
  pGen->pEnd = pSVar2;
  if (sVar6 == -10) {
    sVar5 = -10;
  }
  return sVar5;
}

Assistant:

static sxi32 GenStateCompileCaseExpr(jx9_gen_state *pGen, jx9_case_expr *pExpr)
{
	SySet *pInstrContainer;
	SyToken *pEnd, *pTmp;
	sxi32 iNest = 0;
	sxi32 rc;
	/* Delimit the expression */
	pEnd = pGen->pIn;
	while( pEnd < pGen->pEnd ){
		if( pEnd->nType & JX9_TK_LPAREN /*(*/ ){
			/* Increment nesting level */
			iNest++;
		}else if( pEnd->nType & JX9_TK_RPAREN /*)*/ ){
			/* Decrement nesting level */
			iNest--;
		}else if( pEnd->nType & (JX9_TK_SEMI/*';'*/|JX9_TK_COLON/*;'*/) && iNest < 1 ){
			break;
		}
		pEnd++;
	}
	if( pGen->pIn >= pEnd ){
		rc = jx9GenCompileError(pGen, E_ERROR, pGen->pIn->nLine, "Empty case expression");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
	}
	/* Swap token stream */
	pTmp = pGen->pEnd;
	pGen->pEnd = pEnd;
	pInstrContainer = jx9VmGetByteCodeContainer(pGen->pVm);
	jx9VmSetByteCodeContainer(pGen->pVm, &pExpr->aByteCode);
	rc = jx9CompileExpr(&(*pGen), 0, 0);
	/* Emit the done instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_DONE, (rc != SXERR_EMPTY ? 1 : 0), 0, 0, 0);
	jx9VmSetByteCodeContainer(pGen->pVm, pInstrContainer); 
	/* Update token stream */
	pGen->pIn  = pEnd;
	pGen->pEnd = pTmp;
	if( rc == SXERR_ABORT ){
		return SXERR_ABORT;
	}
	return SXRET_OK;
}